

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

void array_negation_test(void)

{
  ushort uVar1;
  array_container_t *container;
  bitset_container_t *dst;
  uint16_t *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  int x;
  uint uVar7;
  ulong uVar8;
  int32_t iVar9;
  bool bVar10;
  
  container = array_container_create();
  dst = bitset_container_create();
  iVar9 = container->cardinality;
  uVar6 = 0;
  iVar5 = 0;
  do {
    if ((iVar9 == 0) ||
       ((puVar2 = container->array, iVar9 != 0x7fffffff && (puVar2[(long)iVar9 + -1] < uVar6)))) {
      if (iVar9 == container->capacity) {
        array_container_grow(container,iVar9 + 1,true);
        iVar9 = container->cardinality;
      }
      container->cardinality = iVar9 + 1;
      container->array[iVar9] = uVar6;
      iVar3 = iVar9 + 1;
    }
    else {
      if (iVar9 < 1) {
        uVar8 = 0;
      }
      else {
        iVar3 = iVar9 + -1;
        uVar8 = 0;
        do {
          uVar4 = iVar3 + (int)uVar8;
          uVar7 = uVar4 >> 1;
          uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffe));
          if (uVar1 < uVar6) {
            uVar8 = (ulong)(uVar7 + 1);
          }
          else {
            iVar3 = iVar9;
            if (uVar1 <= uVar6) goto LAB_001092ff;
            iVar3 = uVar7 - 1;
          }
        } while ((int)uVar8 <= iVar3);
        iVar3 = 0x7fffffff;
        if (iVar9 == 0x7fffffff) goto LAB_001092ff;
      }
      if (iVar9 == container->capacity) {
        array_container_grow(container,iVar9 + 1,true);
        puVar2 = container->array;
      }
      memmove(puVar2 + uVar8 + 1,puVar2 + uVar8,(long)(iVar9 - (int)uVar8) * 2);
      container->array[uVar8] = uVar6;
      iVar3 = container->cardinality + 1;
      container->cardinality = iVar3;
    }
LAB_001092ff:
    iVar9 = iVar3;
    iVar5 = iVar5 + 1;
    uVar6 = uVar6 + 0x1d;
  } while (iVar5 != 0x8d4);
  array_container_negation(container,dst);
  _assert_int_equal((long)dst->cardinality,0xf72c,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x56b);
  uVar8 = 0;
  do {
    uVar6 = (ushort)uVar8;
    bVar10 = uVar6 == (ushort)((short)(((uint)uVar8 & 0xffff) / 0x1d) * 0x1d);
    _assert_true((ulong)(((-(ulong)bVar10 ^ dst->words[uVar8 >> 6]) >> (uVar8 & 0x3f) & 1) != 0),
                 "bitset_container_contains(BO, (uint16_t)x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                 ,(uint)!bVar10 * 2 + 0x56f);
    iVar5 = container->cardinality;
    if (((long)iVar5 == 0) ||
       ((puVar2 = container->array, iVar5 != 0x7fffffff && (puVar2[(long)iVar5 + -1] < uVar6)))) {
      if (iVar5 == container->capacity) {
        array_container_grow(container,iVar5 + 1,true);
        iVar5 = container->cardinality;
      }
      container->cardinality = iVar5 + 1;
      container->array[iVar5] = uVar6;
    }
    else {
      if (iVar5 < 1) {
        uVar7 = 0;
      }
      else {
        iVar3 = iVar5 + -1;
        uVar7 = 0;
        do {
          uVar4 = iVar3 + uVar7 >> 1;
          uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar3 + uVar7 & 0xfffffffe));
          if (uVar1 < uVar6) {
            uVar7 = uVar4 + 1;
          }
          else {
            if (uVar1 <= uVar6) goto LAB_00109462;
            iVar3 = uVar4 - 1;
          }
        } while ((int)uVar7 <= iVar3);
        if (iVar5 == 0x7fffffff) goto LAB_00109462;
      }
      if (iVar5 == container->capacity) {
        array_container_grow(container,iVar5 + 1,true);
        puVar2 = container->array;
      }
      memmove(puVar2 + (ulong)uVar7 + 1,puVar2 + uVar7,(long)(int)(iVar5 - uVar7) * 2);
      container->array[uVar7] = uVar6;
      container->cardinality = container->cardinality + 1;
    }
LAB_00109462:
    uVar7 = (uint)uVar8 + 1;
    uVar8 = (ulong)uVar7;
    if (uVar7 == 0x10000) {
      array_container_free(container);
      bitset_container_free(dst);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(array_negation_test) {
    int ctr = 0;
    array_container_t* AI = array_container_create();
    bitset_container_t* BO = bitset_container_create();

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_negation(AI, BO);
    assert_int_equal(bitset_container_cardinality(BO), (1 << 16) - ctr);

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 29 == 0) {
            assert_false(bitset_container_contains(BO, (uint16_t)x));
        } else {
            assert_true(bitset_container_contains(BO, (uint16_t)x));
        }
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_free(AI);
    bitset_container_free(BO);
}